

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_recip_d_mips(CPUMIPSState *env,uint64_t fdt0)

{
  float64 fVar1;
  uintptr_t unaff_retaddr;
  uint64_t fdt2;
  uint64_t fdt0_local;
  CPUMIPSState *env_local;
  
  fVar1 = float64_div_mips(0x3ff0000000000000,fdt0,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

uint64_t helper_float_recip_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint64_t fdt2;

    fdt2 = float64_div(float64_one, fdt0, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return fdt2;
}